

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::regrid(Amr *this,int lbase,Real time,bool initial)

{
  long lVar1;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var2;
  pointer puVar3;
  tuple<amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> tVar4;
  long *plVar5;
  pointer piVar6;
  bool bVar7;
  ostream *poVar8;
  ulong uVar9;
  long *plVar10;
  Print *pPVar11;
  int iVar12;
  undefined7 in_register_00000011;
  int iVar13;
  long lVar14;
  BoxArray *rhs;
  long lVar15;
  int lev;
  long lVar16;
  long lVar17;
  long lVar18;
  int new_finest;
  ulong local_230;
  undefined4 local_228;
  uint local_224;
  Real local_220;
  ulong local_218;
  long local_210;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> new_grid_places;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> new_dmap;
  undefined1 local_1b8 [16];
  ostream local_1a8 [376];
  
  local_228 = (undefined4)CONCAT71(in_register_00000011,initial);
  iVar13 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  iVar12 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  if (iVar13 + -1 < iVar12) {
    iVar12 = iVar13 + -1;
  }
  if (iVar12 < lbase) {
    return;
  }
  local_220 = time;
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    poVar8 = OutStream();
    Print::Print((Print *)local_1b8,poVar8);
    std::operator<<(local_1a8,"Now regridding at level lbase = ");
    std::ostream::operator<<(local_1a8,lbase);
    std::operator<<(local_1a8,"\n");
    Print::~Print((Print *)local_1b8);
    iVar13 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  }
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            (&new_grid_places.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
             (long)(iVar13 + 1),(allocator_type *)local_1b8);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
            (&new_dmap.
              super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,
             (long)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + 1,
             (allocator_type *)local_1b8);
  rhs = (BoxArray *)(ulong)(uint)lbase;
  grid_places(this,lbase,local_220,&new_finest,&new_grid_places);
  if ((lbase == 0 & ((byte)local_228 ^ 1)) == 0) {
    local_224 = lbase + 1;
  }
  else {
    if (this->loadbalance_with_workestimates == 0) {
      rhs = (BoxArray *)
            ((long)(((this->amr_level).
                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> +
            0xd8);
      bVar7 = BoxArray::operator!=
                        (new_grid_places.
                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start,rhs);
      if (!bVar7) {
        local_224 = 1;
        goto LAB_00478e0d;
      }
    }
    local_224 = 0;
  }
LAB_00478e0d:
  local_218 = (ulong)local_224;
  iVar13 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  local_230 = CONCAT44(local_230._4_4_,(int)CONCAT71((int7)((ulong)rhs >> 8),iVar13 == new_finest));
  if (new_finest < iVar13) {
    iVar13 = new_finest;
  }
  lVar14 = (long)(int)local_224;
  lVar17 = lVar14 * 0x68;
  lVar15 = lVar14 << 4;
  local_210 = lVar14;
  for (; lVar14 <= iVar13; lVar14 = lVar14 + 1) {
    bVar7 = BoxArray::operator==
                      ((BoxArray *)
                       ((long)&((new_grid_places.
                                 super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                       lVar17),(BoxArray *)
                               ((long)(this->amr_level).
                                      super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                      .
                                      super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t.
                                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               + 0xd8));
    if (bVar7) {
      BoxArray::operator=((BoxArray *)
                          ((long)&((new_grid_places.
                                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                          lVar17),(BoxArray *)
                                  ((long)(this->amr_level).
                                         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         .
                                         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  + 0xd8));
      std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&((new_dmap.
                           super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                           .
                           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar15),
                 (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)(this->amr_level).
                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                 + 0x140));
    }
    else {
      local_230 = local_230 & 0xffffffff00000000;
    }
    lVar17 = lVar17 + 0x68;
    lVar15 = lVar15 + 0x10;
  }
  lVar14 = local_210;
  if (((byte)local_230 & (anonymous_namespace)::use_efficient_regrid == 1) == 0) {
    for (; uVar9 = (ulong)*(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
        lVar14 <= (long)uVar9; lVar14 = lVar14 + 1) {
      _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (this->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      if (*(int *)((long)_Var2.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x20c) == 0
         ) {
        (**(code **)(*(long *)_Var2.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd0))
                  ();
      }
    }
    iVar13 = new_finest;
    for (lVar14 = (long)new_finest; lVar15 = local_210, iVar13 = iVar13 + 1, lVar14 < (int)uVar9;
        lVar14 = lVar14 + 1) {
      puVar3 = (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      tVar4.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> *)
            &puVar3[lVar14 + 1]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      puVar3[lVar14 + 1]._M_t.
      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> =
           (__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>)0x0;
      if (tVar4.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::AmrLevel_*,_false>)0x0) {
        (**(code **)(*(long *)tVar4.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 8))();
      }
      AmrMesh::ClearBoxArray((AmrMesh *)this,iVar13);
      AmrMesh::ClearDistributionMap((AmrMesh *)this,iVar13);
      uVar9 = (ulong)*(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    }
    *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c = new_finest;
    local_230 = local_210 * 8;
    lVar16 = local_210 * 200;
    lVar17 = local_210 << 4;
    lVar14 = local_210 * 0x68;
    for (lVar18 = 0; lVar1 = local_210 + lVar18, lVar1 <= new_finest; lVar18 = lVar18 + 1) {
      if (this->loadbalance_with_workestimates == 0 || (char)local_228 != '\0') {
        plVar5 = *(long **)((long)&((new_dmap.
                                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                     .
                                     super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                                   super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar17);
        if (*plVar5 == plVar5[1]) {
          DistributionMapping::define
                    ((DistributionMapping *)
                     ((long)&((new_dmap.
                               super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               .
                               super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar17),
                     (BoxArray *)
                     ((long)&((new_grid_places.
                               super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                     lVar14),*(int *)(ParallelContext::frames + 0x10));
        }
      }
      else {
        makeLoadBalanceDistributionMap
                  ((Amr *)local_1b8,(int)this,local_220,
                   (BoxArray *)(ulong)(uint)((int)local_218 + (int)lVar18));
        std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((new_dmap.
                             super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             .
                             super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar17),
                   (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
                   local_1b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8));
      }
      iVar13 = (int)(local_218 + lVar18);
      plVar10 = (long *)(**(code **)(*(long *)this->levelbld + 0x30))
                                  (this->cumtime,this->levelbld,this,local_218 + lVar18 & 0xffffffff
                                   ,(long)(((this->super_AmrCore).super_AmrMesh.geom.
                                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                            .
                                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_CoordSys).offset + lVar16 + 0xfffffffffffffff8U,
                                   (long)&((new_grid_places.
                                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                            .
                                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_bat).
                                          m_bat_type + lVar14,
                                   (long)&((new_dmap.
                                            super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                            .
                                            super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                                          super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + lVar17);
      puVar3 = (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar5 = *(long **)((long)&puVar3[lVar18]._M_t.
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         + local_230);
      if ((char)local_228 == '\0') {
        if (plVar5 == (long *)0x0) {
          (**(code **)(*plVar10 + 0xe0))(plVar10);
          puVar3 = (this->amr_level).
                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          plVar5 = *(long **)((long)&puVar3[lVar18]._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                             + local_230);
          *(long **)((long)&puVar3[lVar18]._M_t.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                    + local_230) = plVar10;
          if (plVar5 != (long *)0x0) {
            (**(code **)(*plVar5 + 8))();
          }
          if (0 < lVar1) {
            piVar6 = (this->level_steps).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            piVar6[lVar15 + lVar18] =
                 (this->n_cycle).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[lVar15 + lVar18 + -1] * piVar6[lVar15 + lVar18 + -1];
          }
        }
        else {
          (**(code **)(*plVar10 + 0xd8))(plVar10);
          puVar3 = (this->amr_level).
                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          plVar5 = *(long **)((long)&puVar3[lVar18]._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                             + local_230);
          *(long **)((long)&puVar3[lVar18]._M_t.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                    + local_230) = plVar10;
          if (plVar5 != (long *)0x0) {
            (**(code **)(*plVar5 + 8))();
          }
        }
        uVar9 = local_230;
        AmrMesh::SetBoxArray
                  ((AmrMesh *)this,iVar13,
                   (BoxArray *)
                   (*(long *)((long)&(this->amr_level).
                                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     .
                                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar18]._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                             + local_230) + 0xd8));
        AmrMesh::SetDistributionMap
                  ((AmrMesh *)this,iVar13,
                   (DistributionMapping *)
                   (*(long *)((long)&(this->amr_level).
                                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     .
                                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar18]._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                             + uVar9) + 0x140));
      }
      else {
        *(long **)((long)&puVar3[lVar18]._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                  + local_230) = plVar10;
        if (plVar5 != (long *)0x0) {
          (**(code **)(*plVar5 + 8))(plVar5);
        }
        uVar9 = local_230;
        AmrMesh::SetBoxArray
                  ((AmrMesh *)this,iVar13,
                   (BoxArray *)
                   (*(long *)((long)&(this->amr_level).
                                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     .
                                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar18]._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                             + local_230) + 0xd8));
        AmrMesh::SetDistributionMap
                  ((AmrMesh *)this,iVar13,
                   (DistributionMapping *)
                   (*(long *)((long)&(this->amr_level).
                                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     .
                                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar18]._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                             + uVar9) + 0x140));
        (**(code **)(**(long **)((long)&(this->amr_level).
                                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                        .
                                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar18]._M_t.
                                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                + uVar9) + 0xb8))();
      }
      lVar16 = lVar16 + 200;
      lVar17 = lVar17 + 0x10;
      lVar14 = lVar14 + 0x68;
    }
    for (lVar14 = 0; lVar14 <= new_finest; lVar14 = lVar14 + 1) {
      _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (this->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      (**(code **)(*(long *)_Var2.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                            .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x98))
                (_Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                 super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                 (BoxArray *)(ulong)(uint)lbase);
    }
    if ((this->record_run_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
      poVar8 = std::operator<<((ostream *)&this->runlog,"REGRID: at level lbase = ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,lbase);
      std::operator<<(poVar8,'\n');
      printGridInfo(this,(ostream *)&this->runlog,local_224,
                    *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
    }
    if ((this->record_grid_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
      if (lbase == 0) {
        poVar8 = std::operator<<((ostream *)&this->gridlog,"STEP = ");
        poVar8 = (ostream *)
                 std::ostream::operator<<
                           (poVar8,*(this->level_steps).super_vector<int,_std::allocator<int>_>.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
        std::operator<<(poVar8,' ');
      }
      std::operator<<((ostream *)&this->gridlog,"TIME = ");
      poVar8 = std::ostream::_M_insert<double>(local_220);
      poVar8 = std::operator<<(poVar8," : REGRID  with lbase = ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,lbase);
      std::operator<<(poVar8,'\n');
      printGridInfo(this,(ostream *)&this->gridlog,(int)local_218,
                    *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
    }
    if ((0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) &&
       (*(int *)(ParallelContext::frames + 0xc) == 0)) {
      if (lbase == 0) {
        poVar8 = OutStream();
        Print::Print((Print *)local_1b8,poVar8);
        std::operator<<(local_1a8,"STEP = ");
        pPVar11 = Print::operator<<((Print *)local_1b8,
                                    (this->level_steps).super_vector<int,_std::allocator<int>_>.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
        std::operator<<((ostream *)&pPVar11->ss,' ');
        Print::~Print((Print *)local_1b8);
      }
      poVar8 = OutStream();
      Print::Print((Print *)local_1b8,poVar8);
      std::operator<<(local_1a8,"TIME = ");
      std::ostream::_M_insert<double>(local_220);
      std::operator<<(local_1a8," : REGRID  with lbase = ");
      std::ostream::operator<<(local_1a8,lbase);
      std::endl<char,std::char_traits<char>>(local_1a8);
      Print::~Print((Print *)local_1b8);
      if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose < 2) {
        poVar8 = OutStream();
        AmrCore::printGridSummary
                  (&this->super_AmrCore,poVar8,(int)local_218,
                   *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
      else {
        poVar8 = OutStream();
        printGridInfo(this,poVar8,local_224,
                      *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
    }
  }
  else if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    poVar8 = OutStream();
    Print::Print((Print *)local_1b8,poVar8);
    std::operator<<(local_1a8,"Regridding at level lbase = ");
    std::ostream::operator<<(local_1a8,lbase);
    std::operator<<(local_1a8," but grids unchanged\n");
    Print::~Print((Print *)local_1b8);
  }
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
            (&new_dmap.
              super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>)
  ;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
            (&new_grid_places.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
  return;
}

Assistant:

void
Amr::regrid (int  lbase,
             Real time,
             bool initial)
{
    BL_PROFILE("Amr::regrid()");

    if (lbase > std::min(finest_level,max_level-1)) return;

    if (verbose > 0)
        amrex::Print() << "Now regridding at level lbase = " << lbase << "\n";

    //
    // Compute positions of new grids.
    //
    int             new_finest;
    Vector<BoxArray> new_grid_places(max_level+1);
    Vector<DistributionMapping> new_dmap(max_level+1);

    grid_places(lbase,time,new_finest, new_grid_places);

    bool regrid_level_zero = (!initial) && (lbase == 0)
        && ( loadbalance_with_workestimates || (new_grid_places[0] != amr_level[0]->boxArray()));

    const int start = regrid_level_zero ? 0 : lbase+1;

    bool grids_unchanged = finest_level == new_finest;
    for (int lev = start, End = std::min(finest_level,new_finest); lev <= End; lev++) {
        if (new_grid_places[lev] == amr_level[lev]->boxArray()) {
            new_grid_places[lev] = amr_level[lev]->boxArray();  // to avoid duplicates
            new_dmap[lev] = amr_level[lev]->DistributionMap();
        } else {
            grids_unchanged = false;
        }
    }

    //
    // If use_efficient_regrid flag is set and grids are unchanged, then don't do anything more here.
    //
    if (use_efficient_regrid == 1 && grids_unchanged )
    {
        if (verbose > 0) {
            amrex::Print() << "Regridding at level lbase = " << lbase
                           << " but grids unchanged\n";
        }
        return;
    }

    //
    // Reclaim old-time grid space for all remain levels > lbase.
    // But skip this if we're in the middle of a post-timestep regrid.
    //
    for(int lev = start; lev <= finest_level; ++lev) {
        if (!amr_level[lev]->postStepRegrid()) {
            amr_level[lev]->removeOldData();
        }
    }
    //
    // Reclaim all remaining storage for levels > new_finest.
    //
    for(int lev = new_finest + 1; lev <= finest_level; ++lev) {
        amr_level[lev].reset();
        this->ClearBoxArray(lev);
        this->ClearDistributionMap(lev);
    }

    finest_level = new_finest;

    //
    // Define the new grids from level start up to new_finest.
    //
    for(int lev = start; lev <= new_finest; ++lev) {
        //
        // Construct skeleton of new level.
        //

        if (loadbalance_with_workestimates && !initial) {
            new_dmap[lev] = makeLoadBalanceDistributionMap(lev, time, new_grid_places[lev]);
        }
        else if (new_dmap[lev].empty()) {
            new_dmap[lev].define(new_grid_places[lev]);
        }

        AmrLevel* a = (*levelbld)(*this,lev,Geom(lev),new_grid_places[lev],
                                  new_dmap[lev],cumtime);

        if (initial)
        {
            //
            // We're being called on startup from bldFineLevels().
            // NOTE: The initData function may use a filPatch, and so needs to
            //       be officially inserted into the hierarchy prior to the call.
            //
            amr_level[lev].reset(a);
            this->SetBoxArray(lev, amr_level[lev]->boxArray());
            this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
            amr_level[lev]->initData();
        }
        else if (amr_level[lev])
        {
            //
            // Init with data from old structure then remove old structure.
            // NOTE: The init function may use a filPatch from the old level,
            //       which therefore needs remain in the hierarchy during the call.
            //
            a->init(*amr_level[lev]);
            amr_level[lev].reset(a);
            this->SetBoxArray(lev, amr_level[lev]->boxArray());
            this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
        }
        else
        {
            a->init();
            amr_level[lev].reset(a);
            if (lev > 0)
                level_steps[lev] = level_steps[lev-1] * n_cycle[lev-1];
            this->SetBoxArray(lev, amr_level[lev]->boxArray());
            this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
        }

    }


    //
    // Check at *all* levels whether we need to do anything special now that the grids
    //       at levels lbase+1 and higher may have changed.
    //
    for(int lev(0); lev <= new_finest; ++lev) {
        amr_level[lev]->post_regrid(lbase,new_finest);
    }

    //
    // Report creation of new grids.
    //

    if (record_run_info && ParallelDescriptor::IOProcessor())
    {
        runlog << "REGRID: at level lbase = " << lbase << '\n';
        printGridInfo(runlog,start,finest_level);
    }

    if (record_grid_info && ParallelDescriptor::IOProcessor())
    {
        if (lbase == 0)
            gridlog << "STEP = " << level_steps[0] << ' ';

        gridlog << "TIME = "
                << time
                << " : REGRID  with lbase = "
                << lbase
                << '\n';

        printGridInfo(gridlog,start,finest_level);
    }

    if (verbose > 0 && ParallelDescriptor::IOProcessor())
    {
        if (lbase == 0) {
            amrex::Print() << "STEP = " << level_steps[0] << ' ';
        }

        amrex::Print() << "TIME = "
                       << time
                       << " : REGRID  with lbase = "
                       << lbase
                       << std::endl;

        if (verbose > 1)
        {
            printGridInfo(amrex::OutStream(),start,finest_level);
        }
        else
        {
            printGridSummary(amrex::OutStream(),start,finest_level);
        }
    }
}